

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::segment::Atlas::growCharts(Atlas *this,float threshold)

{
  CostQueue *this_00;
  Chart *pCVar1;
  bool bVar2;
  uint32_t index;
  Chart **ppCVar3;
  int *piVar4;
  uint *value;
  uint32_t face;
  uint32_t index_00;
  uint index_01;
  float fVar5;
  float local_58;
  
  if (this->m_facesLeft != 0) {
    face = 0xffffffff;
    index_01 = 0;
    local_58 = 3.4028235e+38;
    index_00 = 0xffffffff;
    do {
      for (; index_01 < (this->m_charts).m_base.size; index_01 = index_01 + 1) {
        ppCVar3 = Array<xatlas::internal::segment::Chart_*>::operator[](&this->m_charts,index_01);
        pCVar1 = *ppCVar3;
        this_00 = &pCVar1->candidates;
        while ((pCVar1->candidates).m_pairs.m_base.size != 0) {
          fVar5 = CostQueue::peekCost(this_00);
          index = CostQueue::peekFace(this_00);
          piVar4 = Array<int>::operator[](&this->m_faceCharts,index);
          if (*piVar4 == -1) {
            if ((index != 0xffffffff) && (fVar5 < local_58)) {
              index_00 = index_01;
              local_58 = fVar5;
              face = index;
            }
            break;
          }
          CostQueue::pop(this_00);
        }
      }
      if (face == 0xffffffff) {
        return;
      }
      if (threshold < local_58) {
        return;
      }
      ppCVar3 = Array<xatlas::internal::segment::Chart_*>::operator[](&this->m_charts,index_00);
      pCVar1 = *ppCVar3;
      CostQueue::pop(&pCVar1->candidates);
      bVar2 = addFaceToChart(this,pCVar1,face);
      if (!bVar2) {
        value = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,face);
        ArrayBase::push_back(&(pCVar1->failedPlanarRegions).m_base,(uint8_t *)value);
      }
      if (threshold < local_58) {
        return;
      }
      local_58 = 3.4028235e+38;
      index_01 = 0;
      face = 0xffffffff;
      index_00 = 0xffffffff;
    } while (this->m_facesLeft != 0);
  }
  return;
}

Assistant:

void growCharts(float threshold)
	{
		XA_PROFILE_START(buildAtlasGrowCharts)
		for (;;) {
			if (m_facesLeft == 0)
				break;
			// Get the single best candidate out of the chart best candidates.
			uint32_t bestFace = UINT32_MAX, bestChart = UINT32_MAX;
			float lowestCost = FLT_MAX;
			for (uint32_t i = 0; i < m_charts.size(); i++) {
				Chart *chart = m_charts[i];
				// Get the best candidate from the chart.
				// Cleanup any best candidates that have been claimed by another chart.
				uint32_t face = UINT32_MAX;
				float cost = FLT_MAX;
				for (;;) {
					if (chart->candidates.count() == 0)
						break;
					cost = chart->candidates.peekCost();
					face = chart->candidates.peekFace();
					if (m_faceCharts[face] == -1)
						break;
					else {
						// Face belongs to another chart. Pop from queue so the next best candidate can be retrieved.
						chart->candidates.pop();
						face = UINT32_MAX;
					}
				}
				if (face == UINT32_MAX)
					continue; // No candidates for this chart.
				// See if best candidate overall.
				if (cost < lowestCost) {
					lowestCost = cost;
					bestFace = face;
					bestChart = i;
				}
			}
			if (bestFace == UINT32_MAX || lowestCost > threshold)
				break;
			Chart *chart = m_charts[bestChart];
			chart->candidates.pop(); // Pop the selected candidate from the queue.
			if (!addFaceToChart(chart, bestFace))
				chart->failedPlanarRegions.push_back(m_facePlanarRegionId[bestFace]);
		}
		XA_PROFILE_END(buildAtlasGrowCharts)
	}